

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckClear(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  tmbstr ptVar2;
  ctmbstr local_48;
  ctmbstr values [5];
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  values[4] = (ctmbstr)attval;
  memcpy(&local_48,&DAT_001e1660,0x28);
  if ((values[4] == (ctmbstr)0x0) || (*(long *)(values[4] + 0x30) == 0)) {
    prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x256);
    if (*(long *)(values[4] + 0x30) == 0) {
      ptVar2 = prvTidytmbstrdup(doc->allocator,"none");
      *(tmbstr *)(values[4] + 0x30) = ptVar2;
    }
  }
  else {
    CheckLowerCaseAttrValue(doc,node,(AttVal *)values[4]);
    BVar1 = AttrValueIsAmong((AttVal *)values[4],&local_48);
    if (BVar1 == no) {
      prvTidyReportAttrError(doc,node,(AttVal *)values[4],0x22b);
    }
  }
  return;
}

Assistant:

void CheckClear( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"none", "left", "right", "all", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        if (attval->value == NULL)
            attval->value = TY_(tmbstrdup)( doc->allocator, "none" );
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );
        
    if (!AttrValueIsAmong(attval, values))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}